

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datamodel.cpp
# Opt level: O0

void __thiscall FSSDataModel::saveSetting(FSSDataModel *this,PSource *source)

{
  DataSourceType DVar1;
  element_type *peVar2;
  char *pcVar3;
  string local_150 [32];
  QVariant local_130;
  QString local_110;
  string local_f8 [32];
  QVariant local_d8;
  QString local_b8;
  string local_a0 [32];
  QVariant local_80;
  QString local_60;
  shared_ptr<Data::Source> local_38;
  undefined1 local_28 [8];
  QSettings settings;
  PSource *source_local;
  FSSDataModel *this_local;
  
  QSettings::QSettings((QSettings *)local_28,(QObject *)0x0);
  std::shared_ptr<Data::Source>::shared_ptr(&local_38,source);
  DVar1 = getType(&local_38);
  std::shared_ptr<Data::Source>::~shared_ptr(&local_38);
  if (DVar1 == DataSourceTypeDos) {
    QString::QString(&local_60,"sources/dos");
    peVar2 = std::__shared_ptr_access<Data::Source,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Data::Source,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)source);
    (*peVar2->_vptr_Source[1])(local_a0);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    QVariant::QVariant(&local_80,pcVar3);
    QSettings::setValue((QString *)local_28,(QVariant *)&local_60);
    QVariant::~QVariant(&local_80);
    std::__cxx11::string::~string(local_a0);
    QString::~QString(&local_60);
  }
  else if (DVar1 == DataSourceTypeAmiga) {
    QString::QString(&local_b8,"sources/amiga");
    peVar2 = std::__shared_ptr_access<Data::Source,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Data::Source,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)source);
    (*peVar2->_vptr_Source[1])(local_f8);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    QVariant::QVariant(&local_d8,pcVar3);
    QSettings::setValue((QString *)local_28,(QVariant *)&local_b8);
    QVariant::~QVariant(&local_d8);
    std::__cxx11::string::~string(local_f8);
    QString::~QString(&local_b8);
  }
  else if (DVar1 == DataSourceTypeCustom) {
    QString::QString(&local_110,"sources/custom");
    peVar2 = std::__shared_ptr_access<Data::Source,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Data::Source,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)source);
    (*peVar2->_vptr_Source[1])(local_150);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    QVariant::QVariant(&local_130,pcVar3);
    QSettings::setValue((QString *)local_28,(QVariant *)&local_110);
    QVariant::~QVariant(&local_130);
    std::__cxx11::string::~string(local_150);
    QString::~QString(&local_110);
  }
  QSettings::sync();
  QSettings::~QSettings((QSettings *)local_28);
  return;
}

Assistant:

void
FSSDataModel::saveSetting(Data::PSource source) {
  QSettings settings;
  switch (getType(source)) {
    case DataSourceTypeDos:
      settings.setValue("sources/dos", source->get_path().c_str());
      break;
    case DataSourceTypeAmiga:
      settings.setValue("sources/amiga", source->get_path().c_str());
      break;
    case DataSourceTypeCustom:
      settings.setValue("sources/custom", source->get_path().c_str());
      break;
  }
  settings.sync();
}